

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O2

int stbtt_FindMatchingFont(uchar *font_collection,char *name_utf8,stbtt_int32 flags)

{
  stbtt_int32 next_id;
  uint fontstart;
  int iVar1;
  stbtt_uint32 sVar2;
  size_t sVar3;
  stbtt_int32 nlen;
  int index;
  
  index = 0;
  do {
    fontstart = stbtt_GetFontOffsetForIndex(font_collection,index);
    if ((int)fontstart < 0) {
      return fontstart;
    }
    sVar3 = strlen(name_utf8);
    iVar1 = stbtt__isfont(font_collection + fontstart);
    if ((iVar1 != 0) &&
       (((flags == 0 ||
         (sVar2 = stbtt__find_table(font_collection,fontstart,"head"),
         (flags & 7U) == (font_collection[(ulong)sVar2 + 0x2d] & 7))) &&
        (sVar2 = stbtt__find_table(font_collection,fontstart,"name"), sVar2 != 0)))) {
      nlen = (stbtt_int32)sVar3;
      if (flags == 0) {
        iVar1 = stbtt__matchpair(font_collection,sVar2,(stbtt_uint8 *)name_utf8,nlen,0x10,0x11);
        if (iVar1 != 0) {
          return fontstart;
        }
        next_id = 2;
      }
      else {
        iVar1 = stbtt__matchpair(font_collection,sVar2,(stbtt_uint8 *)name_utf8,nlen,0x10,-1);
        if (iVar1 != 0) {
          return fontstart;
        }
        next_id = -1;
      }
      iVar1 = stbtt__matchpair(font_collection,sVar2,(stbtt_uint8 *)name_utf8,nlen,1,next_id);
      if (iVar1 != 0) {
        return fontstart;
      }
      iVar1 = stbtt__matchpair(font_collection,sVar2,(stbtt_uint8 *)name_utf8,nlen,3,-1);
      if (iVar1 != 0) {
        return fontstart;
      }
    }
    index = index + 1;
  } while( true );
}

Assistant:

STBTT_DEF int stbtt_FindMatchingFont(const unsigned char *font_collection, const char *name_utf8, stbtt_int32 flags)
{
   stbtt_int32 i;
   for (i=0;;++i) {
      stbtt_int32 off = stbtt_GetFontOffsetForIndex(font_collection, i);
      if (off < 0) return off;
      if (stbtt__matches((stbtt_uint8 *) font_collection, off, (stbtt_uint8*) name_utf8, flags))
         return off;
   }
}